

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeMsg.cpp
# Opt level: O0

bool MsgHelper::checkClientMsg(uint8_t *buf)

{
  uint8_t uVar1;
  undefined1 local_12;
  PIPEMSG_TYPE type;
  uint8_t *buf_local;
  
  uVar1 = *buf;
  local_12 = true;
  if ((((uVar1 != '\x02') && (local_12 = true, uVar1 != '\x03')) &&
      (local_12 = true, uVar1 != '\x05')) && (local_12 = true, uVar1 != '\x06')) {
    local_12 = uVar1 == '\a';
  }
  return local_12;
}

Assistant:

bool MsgHelper::checkClientMsg(uint8_t* buf)
{
	PIPEMSG_TYPE type = (PIPEMSG_TYPE)buf[0];
	return type == PIPEMSG_TYPE::S2C_RESPONSE ||
		type == PIPEMSG_TYPE::SEND_TCP_DATA ||
		type == PIPEMSG_TYPE::S2C_UDP_DATA ||
		type == PIPEMSG_TYPE::S2C_DISCONNECT ||
		type == PIPEMSG_TYPE::S2C_CANNOT_RESOLVE_ADDR;
}